

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# managed_buffer.cpp
# Opt level: O0

void __thiscall
polyscope::render::ManagedBuffer<glm::vec<2,_float,_(glm::qualifier)0>_>::markHostBufferUpdated
          (ManagedBuffer<glm::vec<2,_float,_(glm::qualifier)0>_> *this)

{
  bool bVar1;
  element_type *peVar2;
  element_type *peVar3;
  long in_RDI;
  ManagedBuffer<glm::vec<2,_float,_(glm::qualifier)0>_> *in_stack_00000060;
  
  *(undefined1 *)(in_RDI + 0x68) = 1;
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x70));
  if (bVar1) {
    peVar2 = std::
             __shared_ptr_access<polyscope::render::AttributeBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<polyscope::render::AttributeBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x412ca4);
    (*peVar2->_vptr_AttributeBuffer[2])(peVar2,*(undefined8 *)(in_RDI + 0x38));
    requestRedraw();
  }
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x80));
  if (bVar1) {
    peVar3 = std::
             __shared_ptr_access<polyscope::render::TextureBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<polyscope::render::TextureBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x412ce3);
    (*peVar3->_vptr_TextureBuffer[5])(peVar3,*(undefined8 *)(in_RDI + 0x38));
    requestRedraw();
  }
  if (*(int *)(in_RDI + 0x90) == 0) {
    updateIndexedViews(in_stack_00000060);
    requestRedraw();
  }
  return;
}

Assistant:

void ManagedBuffer<T>::markHostBufferUpdated() {
  hostBufferIsPopulated = true;

  // If the data is stored in the device-side buffers, update it as needed
  if (renderAttributeBuffer) {
    renderAttributeBuffer->setData(data);
    requestRedraw();
  }

  if (renderTextureBuffer) {
    renderTextureBuffer->setData(data);
    requestRedraw();
  }

  if (deviceBufferType == DeviceBufferType::Attribute) {
    updateIndexedViews();
    requestRedraw();
  }
}